

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlFreeTextReader(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_50;
  xmlTextReaderErrorFunc local_48;
  void *arg;
  xmlTextReaderErrorFunc f;
  xmlTextReaderPyCtxtPtr pyCtxt;
  PyObject *pyobj_reader;
  xmlTextReaderPtr reader;
  PyObject *args_local;
  PyObject *self_local;
  
  reader = (xmlTextReaderPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlFreeTextReader",&pyCtxt);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _Py_IS_TYPE((PyObject *)pyCtxt,(PyTypeObject *)&PyCapsule_Type);
    if (iVar1 == 0) {
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
    else {
      if (pyCtxt == (xmlTextReaderPyCtxtPtr)&_Py_NoneStruct) {
        local_50 = (PyObject *)0x0;
      }
      else {
        local_50 = pyCtxt[1].f;
      }
      pyobj_reader = local_50;
      if (local_50 == (PyObject *)0x0) {
        _Py_INCREF((PyObject *)&_Py_NoneStruct);
        self_local = (PyObject *)&_Py_NoneStruct;
      }
      else {
        xmlTextReaderGetErrorHandler(local_50,&arg,&local_48);
        if ((local_48 != (xmlTextReaderErrorFunc)0x0) &&
           ((code *)arg == libxml_xmlTextReaderErrorCallback)) {
          f = local_48;
          _Py_XDECREF(*(PyObject **)local_48);
          _Py_XDECREF(*(PyObject **)(f + 8));
          (*_xmlFree)(f);
        }
        xmlFreeTextReader(pyobj_reader);
        _Py_INCREF((PyObject *)&_Py_NoneStruct);
        self_local = (PyObject *)&_Py_NoneStruct;
      }
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlFreeTextReader(ATTRIBUTE_UNUSED PyObject *self, PyObject *args) {
    xmlTextReaderPtr reader;
    PyObject *pyobj_reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlFreeTextReader", &pyobj_reader))
        return(NULL);
    if (!PyCapsule_CheckExact(pyobj_reader)) {
	Py_INCREF(Py_None);
	return(Py_None);
    }
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    if (reader == NULL) {
	Py_INCREF(Py_None);
	return(Py_None);
    }

    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    if (arg != NULL) {
	if (f == (xmlTextReaderErrorFunc) libxml_xmlTextReaderErrorCallback) {
	    /* ok, it's our error handler! */
	    pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	    Py_XDECREF(pyCtxt->f);
	    Py_XDECREF(pyCtxt->arg);
	    xmlFree(pyCtxt);
	}
	/* 
	 * else, something wrong happened, because the error handler is
	 * not owned by the python bindings...
	 */
    }

    xmlFreeTextReader(reader);
    Py_INCREF(Py_None);
    return(Py_None);
}